

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_union.c
# Opt level: O2

void array_run_container_inplace_union(array_container_t *src_1,run_container_t *src_2)

{
  rle16_t *prVar1;
  rle16_t *prVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  rle16_t local_34;
  
  _Var4 = run_container_is_full(src_2);
  if (_Var4) {
    return;
  }
  iVar5 = src_2->n_runs;
  lVar9 = (long)src_1->cardinality + (long)iVar5;
  iVar8 = (int)lVar9 + iVar5;
  if (src_2->capacity < iVar8) {
    run_container_grow(src_2,iVar8,true);
    iVar5 = src_2->n_runs;
  }
  memmove(src_2->runs + lVar9,src_2->runs,(long)iVar5 << 2);
  prVar2 = src_2->runs;
  prVar1 = prVar2 + lVar9;
  iVar5 = src_2->n_runs;
  src_2->n_runs = 0;
  bVar3 = prVar1->value <= *src_1->array;
  if (bVar3) {
    *prVar2 = *prVar1;
    iVar8 = src_2->n_runs + 1;
  }
  else {
    prVar2->value = *src_1->array;
    prVar2->length = 0;
    iVar8 = 1;
  }
  uVar10 = (ulong)bVar3;
  uVar7 = (ulong)!bVar3;
  src_2->n_runs = iVar8;
  do {
    uVar10 = (ulong)(int)uVar10;
    while( true ) {
      iVar8 = src_1->cardinality;
      iVar6 = (int)uVar7;
      if ((iVar5 <= (int)uVar10) || (iVar8 <= iVar6)) {
        if (iVar6 < iVar8) {
          for (; (long)uVar7 < (long)iVar8; uVar7 = uVar7 + 1) {
            run_container_append_value(src_2,src_1->array[uVar7],&local_34);
            iVar8 = src_1->cardinality;
          }
          return;
        }
        for (; (long)uVar10 < (long)iVar5; uVar10 = uVar10 + 1) {
          run_container_append(src_2,prVar1[uVar10],&local_34);
        }
        return;
      }
      if (src_1->array[uVar7] < prVar1[uVar10].value) break;
      run_container_append(src_2,prVar1[uVar10],&local_34);
      uVar10 = uVar10 + 1;
    }
    run_container_append_value(src_2,src_1->array[uVar7],&local_34);
    uVar7 = (ulong)(iVar6 + 1);
  } while( true );
}

Assistant:

void array_run_container_inplace_union(const array_container_t *src_1,
                                       run_container_t *src_2) {
    if (run_container_is_full(src_2)) {
        return;
    }
    const int32_t maxoutput = src_1->cardinality + src_2->n_runs;
    const int32_t neededcapacity = maxoutput + src_2->n_runs;
    if (src_2->capacity < neededcapacity)
        run_container_grow(src_2, neededcapacity, true);
    memmove(src_2->runs + maxoutput, src_2->runs,
            src_2->n_runs * sizeof(rle16_t));
    rle16_t *inputsrc2 = src_2->runs + maxoutput;
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    int src2nruns = src_2->n_runs;
    src_2->n_runs = 0;

    rle16_t previousrle;

    if (inputsrc2[rlepos].value <= src_1->array[arraypos]) {
        previousrle = run_container_append_first(src_2, inputsrc2[rlepos]);
        rlepos++;
    } else {
        previousrle =
            run_container_append_value_first(src_2, src_1->array[arraypos]);
        arraypos++;
    }

    while ((rlepos < src2nruns) && (arraypos < src_1->cardinality)) {
        if (inputsrc2[rlepos].value <= src_1->array[arraypos]) {
            run_container_append(src_2, inputsrc2[rlepos], &previousrle);
            rlepos++;
        } else {
            run_container_append_value(src_2, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    }
    if (arraypos < src_1->cardinality) {
        while (arraypos < src_1->cardinality) {
            run_container_append_value(src_2, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    } else {
        while (rlepos < src2nruns) {
            run_container_append(src_2, inputsrc2[rlepos], &previousrle);
            rlepos++;
        }
    }
}